

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

ostream * __thiscall wasm::ValidationInfo::printFailureHeader(ValidationInfo *this,Function *func)

{
  ostringstream *stream;
  char *in_RCX;
  char *pcVar1;
  Name name;
  
  stream = getStream_abi_cxx11_(this,func);
  if (this->quiet == false) {
    Colors::red((ostream *)stream);
    if (func == (Function *)0x0) {
      pcVar1 = "[wasm-validator error in module] ";
    }
    else {
      std::operator<<((ostream *)stream,"[wasm-validator error in function ");
      Colors::green((ostream *)stream);
      name.super_IString.str._M_str = in_RCX;
      name.super_IString.str._M_len =
           (size_t)(func->super_Importable).super_Named.name.super_IString.str._M_str;
      wasm::operator<<((wasm *)stream,
                       (ostream *)(func->super_Importable).super_Named.name.super_IString.str._M_len
                       ,name);
      Colors::red((ostream *)stream);
      pcVar1 = "] ";
    }
    std::operator<<((ostream *)stream,pcVar1);
    Colors::normal((ostream *)stream);
  }
  return (ostream *)stream;
}

Assistant:

std::ostream& printFailureHeader(Function* func) {
    auto& stream = getStream(func);
    if (quiet) {
      return stream;
    }
    Colors::red(stream);
    if (func) {
      stream << "[wasm-validator error in function ";
      Colors::green(stream);
      stream << func->name;
      Colors::red(stream);
      stream << "] ";
    } else {
      stream << "[wasm-validator error in module] ";
    }
    Colors::normal(stream);
    return stream;
  }